

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O1

int bin_mdef_ciphone_id_nocase(bin_mdef_t *m,char *ciphone)

{
  int iVar1;
  int32 iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = m->n_ciphone;
  iVar3 = 0;
  do {
    if ((int)uVar5 <= iVar3) {
      return -1;
    }
    uVar4 = uVar5 + iVar3 >> 1;
    iVar2 = strcmp_nocase(ciphone,m->ciname[uVar4]);
    iVar1 = uVar4 + 1;
    if (iVar2 < 1) {
      iVar1 = iVar3;
    }
    if (iVar2 == 0) {
      iVar1 = iVar3;
    }
    iVar3 = iVar1;
    if (iVar2 < 0) {
      uVar5 = uVar4;
    }
  } while (iVar2 != 0);
  return uVar4;
}

Assistant:

int
bin_mdef_ciphone_id_nocase(bin_mdef_t * m, const char *ciphone)
{
    int low, mid, high;

    /* Exact binary search on m->ciphone */
    low = 0;
    high = m->n_ciphone;
    while (low < high) {
        int c;

        mid = (low + high) / 2;
        c = strcmp_nocase(ciphone, m->ciname[mid]);
        if (c == 0)
            return mid;
        else if (c > 0)
            low = mid + 1;
        else
            high = mid;
    }
    return -1;
}